

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  int i;
  int iVar3;
  randomx_flags rVar4;
  randomx_flags rVar5;
  size_t sVar6;
  ostream *poVar7;
  code *pcVar8;
  unsigned_long uVar9;
  long lVar10;
  runtime_error *prVar11;
  undefined8 *puVar12;
  undefined8 in_RCX;
  char *pcVar13;
  pointer ptVar14;
  pointer_____offset_0x10___ *ppuVar15;
  int iVar16;
  undefined8 unaff_RBP;
  long lVar17;
  undefined8 uVar18;
  ulong uVar19;
  char *pcVar20;
  uint uVar21;
  undefined4 uVar22;
  ulong unaff_R14;
  undefined **ppuVar23;
  char cVar24;
  ulong uVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  undefined1 auVar29 [16];
  double dVar30;
  undefined1 auVar31 [16];
  uint32_t count;
  int noncesCount;
  undefined4 local_11c;
  randomx_flags local_118;
  uint local_114;
  randomx_vm *vm;
  int local_108;
  char local_104 [4];
  randomx_cache *cache;
  vector<randomx_vm_*,_std::allocator<randomx_vm_*>_> vms;
  int cpuid;
  atomic<unsigned_int> atomicNonce;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  uint64_t local_b0;
  uint32_t startItem;
  undefined4 uStack_a4;
  randomx_dataset *dataset;
  long local_98;
  reference_wrapper<std::atomic<unsigned_int>_> local_90;
  undefined4 local_84;
  undefined4 local_80;
  char seed [4];
  randomx_flags local_78;
  MineFunc *func;
  size_type local_68;
  undefined1 local_60 [16];
  AtomicHash result;
  
  if (argc < 1) {
LAB_0010847b:
    lVar17 = 0;
  }
  else {
    iVar3 = strcmp(*argv,"--softAes");
    lVar17 = CONCAT71((int7)((ulong)unaff_RBP >> 8),1);
    if (iVar3 != 0) {
      unaff_R14 = (ulong)(uint)argc;
      uVar25 = 0;
      do {
        if (unaff_R14 - 1 == uVar25) goto LAB_0010847b;
        iVar3 = strcmp(argv[uVar25 + 1],"--softAes");
        uVar25 = uVar25 + 1;
      } while (iVar3 != 0);
      if (unaff_R14 <= uVar25) goto LAB_0010847b;
    }
  }
  if (argc < 1) {
LAB_001084cd:
    local_11c = 0;
  }
  else {
    iVar3 = strcmp(*argv,"--mine");
    local_11c = (undefined4)CONCAT71((int7)((ulong)in_RCX >> 8),1);
    if (iVar3 != 0) {
      unaff_R14 = (ulong)(uint)argc;
      uVar25 = 0;
      do {
        if (unaff_R14 - 1 == uVar25) goto LAB_001084cd;
        iVar3 = strcmp(argv[uVar25 + 1],"--mine");
        uVar25 = uVar25 + 1;
      } while (iVar3 != 0);
      if (unaff_R14 <= uVar25) goto LAB_001084cd;
    }
  }
  if (argc < 1) {
LAB_00108525:
    bVar28 = false;
  }
  else {
    iVar3 = strcmp(*argv,"--verify");
    bVar28 = true;
    if (iVar3 != 0) {
      unaff_R14 = (ulong)(uint)argc;
      uVar25 = 0;
      do {
        if (unaff_R14 - 1 == uVar25) goto LAB_00108525;
        iVar3 = strcmp(argv[uVar25 + 1],"--verify");
        uVar25 = uVar25 + 1;
      } while (iVar3 != 0);
      if (unaff_R14 <= uVar25) goto LAB_00108525;
    }
  }
  local_84 = (undefined4)lVar17;
  if (1 < argc) {
    uVar21 = argc - 1;
    unaff_R14 = -(ulong)uVar21;
    lVar17 = CONCAT71((int7)((ulong)lVar17 >> 8),1);
    uVar25 = 1;
    do {
      iVar3 = strcmp(argv[uVar25 - 1],"--threads");
      if ((iVar3 == 0) && (local_108 = atoi(argv[uVar25]), 0 < local_108)) {
        if ((char)lVar17 != '\0') goto LAB_00108599;
        break;
      }
      lVar17 = CONCAT71((int7)((ulong)lVar17 >> 8),(long)uVar25 < (long)(int)uVar21);
      bVar26 = uVar25 != uVar21;
      uVar25 = uVar25 + 1;
    } while (bVar26);
  }
  local_108 = 1;
LAB_00108599:
  if (1 < argc) {
    uVar21 = argc - 1;
    unaff_R14 = -(ulong)uVar21;
    lVar17 = CONCAT71((int7)((ulong)lVar17 >> 8),1);
    uVar25 = 1;
    do {
      iVar3 = strcmp(argv[uVar25 - 1],"--affinity");
      if ((iVar3 == 0) && (local_b0 = strtoull(argv[uVar25],(char **)0x0,0), local_b0 != 0)) {
        if ((char)lVar17 != '\0') goto LAB_00108607;
        break;
      }
      lVar17 = CONCAT71((int7)((ulong)lVar17 >> 8),(long)uVar25 < (long)(int)uVar21);
      bVar26 = uVar25 != uVar21;
      uVar25 = uVar25 + 1;
    } while (bVar26);
  }
  local_b0 = 0;
LAB_00108607:
  if (1 < argc) {
    uVar21 = argc - 1;
    unaff_R14 = -(ulong)uVar21;
    lVar17 = CONCAT71((int7)((ulong)lVar17 >> 8),1);
    uVar25 = 1;
    do {
      iVar3 = strcmp(argv[uVar25 - 1],"--nonces");
      if ((iVar3 == 0) && (noncesCount = atoi(argv[uVar25]), 0 < noncesCount)) {
        if ((char)lVar17 != '\0') goto LAB_00108670;
        break;
      }
      lVar17 = CONCAT71((int7)((ulong)lVar17 >> 8),(long)uVar25 < (long)(int)uVar21);
      bVar26 = uVar25 != uVar21;
      uVar25 = uVar25 + 1;
    } while (bVar26);
  }
  noncesCount = 1000;
LAB_00108670:
  if (1 < argc) {
    uVar21 = argc - 1;
    lVar17 = (long)(int)uVar21;
    unaff_R14 = -(ulong)uVar21;
    bVar26 = true;
    uVar25 = 1;
    do {
      iVar3 = strcmp(argv[uVar25 - 1],"--init");
      if ((iVar3 == 0) && (local_114 = atoi(argv[uVar25]), 0 < (int)local_114)) {
        if (bVar26) goto LAB_001086d2;
        break;
      }
      bVar26 = (long)uVar25 < lVar17;
      bVar27 = uVar25 != uVar21;
      uVar25 = uVar25 + 1;
    } while (bVar27);
  }
  local_114 = 1;
LAB_001086d2:
  if (1 < argc) {
    uVar21 = argc - 1;
    lVar17 = (long)(int)uVar21;
    unaff_R14 = -(ulong)uVar21;
    bVar26 = true;
    uVar25 = 1;
    do {
      iVar3 = strcmp(argv[uVar25 - 1],"--seed");
      if ((iVar3 == 0) && (local_104 = (char  [4])atoi(argv[uVar25]), 0 < (int)local_104)) {
        if (bVar26) goto LAB_0010873b;
        break;
      }
      bVar26 = (long)uVar25 < lVar17;
      bVar27 = uVar25 != uVar21;
      uVar25 = uVar25 + 1;
    } while (bVar27);
  }
  local_104[0] = '\0';
  local_104[1] = '\0';
  local_104[2] = '\0';
  local_104[3] = '\0';
LAB_0010873b:
  if (argc < 1) {
LAB_00108788:
    uVar18 = 0;
  }
  else {
    iVar3 = strcmp(*argv,"--largePages");
    uVar18 = CONCAT71((int7)((ulong)lVar17 >> 8),1);
    if (iVar3 != 0) {
      unaff_R14 = (ulong)(uint)argc;
      uVar25 = 0;
      do {
        if (unaff_R14 - 1 == uVar25) goto LAB_00108788;
        iVar3 = strcmp(argv[uVar25 + 1],"--largePages");
        uVar25 = uVar25 + 1;
      } while (iVar3 != 0);
      if (unaff_R14 <= uVar25) goto LAB_00108788;
    }
  }
  rVar4 = (randomx_flags)uVar18;
  if ((char)uVar18 == '\0') {
    if (argc < 1) {
LAB_001087dc:
      rVar4 = RANDOMX_FLAG_DEFAULT;
    }
    else {
      iVar3 = strcmp(*argv,"--largepages");
      rVar4 = (randomx_flags)CONCAT71((int7)((ulong)uVar18 >> 8),1);
      if (iVar3 != 0) {
        unaff_R14 = (ulong)(uint)argc;
        uVar25 = 0;
        do {
          if (unaff_R14 - 1 == uVar25) goto LAB_001087dc;
          iVar3 = strcmp(argv[uVar25 + 1],"--largepages");
          uVar25 = uVar25 + 1;
        } while (iVar3 != 0);
        if (unaff_R14 <= uVar25) goto LAB_001087dc;
      }
    }
  }
  if (argc < 1) {
LAB_0010882e:
    bVar26 = false;
  }
  else {
    iVar3 = strcmp(*argv,"--jit");
    bVar26 = true;
    if (iVar3 != 0) {
      unaff_R14 = (ulong)(uint)argc;
      uVar25 = 0;
      do {
        if (unaff_R14 - 1 == uVar25) goto LAB_0010882e;
        iVar3 = strcmp(argv[uVar25 + 1],"--jit");
        uVar25 = uVar25 + 1;
      } while (iVar3 != 0);
      if (unaff_R14 <= uVar25) goto LAB_0010882e;
    }
  }
  local_118 = rVar4;
  if (argc < 1) {
LAB_00108887:
    uVar18 = 0;
  }
  else {
    iVar3 = strcmp(*argv,"--help");
    uVar18 = CONCAT71((int7)(unaff_R14 >> 8),1);
    if (iVar3 != 0) {
      uVar25 = 0;
      do {
        if ((ulong)(uint)argc - 1 == uVar25) goto LAB_00108887;
        iVar3 = strcmp(argv[uVar25 + 1],"--help");
        uVar25 = uVar25 + 1;
      } while (iVar3 != 0);
      if ((uint)argc <= uVar25) goto LAB_00108887;
    }
  }
  local_98 = CONCAT44(local_98._4_4_,(int)uVar18);
  if (argc < 1) {
LAB_001088df:
    uVar22 = 0;
  }
  else {
    iVar3 = strcmp(*argv,"--secure");
    uVar22 = (undefined4)CONCAT71((int7)((ulong)uVar18 >> 8),1);
    if (iVar3 != 0) {
      uVar25 = 0;
      do {
        if ((ulong)(uint)argc - 1 == uVar25) goto LAB_001088df;
        iVar3 = strcmp(argv[uVar25 + 1],"--secure");
        uVar25 = uVar25 + 1;
      } while (iVar3 != 0);
      if ((uint)argc <= uVar25) goto LAB_001088df;
    }
  }
  if (argc < 1) {
LAB_00108939:
    local_78 = RANDOMX_FLAG_DEFAULT;
  }
  else {
    iVar3 = strcmp(*argv,"--ssse3");
    local_78 = RANDOMX_FLAG_ARGON2_SSSE3;
    if (iVar3 != 0) {
      uVar25 = 0;
      do {
        if ((ulong)(uint)argc - 1 == uVar25) goto LAB_00108939;
        iVar3 = strcmp(argv[uVar25 + 1],"--ssse3");
        uVar25 = uVar25 + 1;
      } while (iVar3 != 0);
      if ((uint)argc <= uVar25) goto LAB_00108939;
    }
  }
  if (argc < 1) {
LAB_00108995:
    bVar27 = false;
  }
  else {
    iVar3 = strcmp(*argv,"--avx2");
    bVar27 = true;
    if (iVar3 != 0) {
      uVar25 = 0;
      do {
        if ((ulong)(uint)argc - 1 == uVar25) goto LAB_00108995;
        iVar3 = strcmp(argv[uVar25 + 1],"--avx2");
        uVar25 = uVar25 + 1;
      } while (iVar3 != 0);
      if ((uint)argc <= uVar25) goto LAB_00108995;
    }
  }
  local_80 = uVar22;
  if (argc < 1) {
LAB_001089f2:
    bVar1 = false;
  }
  else {
    iVar3 = strcmp(*argv,"--auto");
    bVar1 = true;
    if (iVar3 != 0) {
      uVar25 = 0;
      do {
        if ((ulong)(uint)argc - 1 == uVar25) goto LAB_001089f2;
        iVar3 = strcmp(argv[uVar25 + 1],"--auto");
        uVar25 = uVar25 + 1;
      } while (iVar3 != 0);
      if ((uint)argc <= uVar25) goto LAB_001089f2;
    }
  }
  if (argc < 1) {
LAB_00108a44:
    bVar2 = false;
  }
  else {
    iVar3 = strcmp(*argv,"--noBatch");
    bVar2 = true;
    if (iVar3 != 0) {
      uVar25 = 0;
      do {
        if ((ulong)(uint)argc - 1 == uVar25) goto LAB_00108a44;
        iVar3 = strcmp(argv[uVar25 + 1],"--noBatch");
        uVar25 = uVar25 + 1;
      } while (iVar3 != 0);
      if ((uint)argc <= uVar25) goto LAB_00108a44;
    }
  }
  seed[0] = local_104[0];
  seed[1] = local_104[1];
  seed[2] = local_104[2];
  seed[3] = local_104[3];
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"RandomX benchmark v1.1.11",0x19);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
  std::ostream::put('8');
  std::ostream::flush();
  iVar3 = local_108;
  uVar22 = local_11c;
  if ((char)local_98 != '\0') {
    printUsage(*argv);
    return 0;
  }
  cVar24 = (char)local_11c;
  if (!bVar28 && cVar24 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "Please select either the fast mode (--mine) or the slow mode (--verify)",0x47);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
    std::ostream::put('8');
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Run \'",5);
    pcVar13 = *argv;
    if (pcVar13 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x124138);
    }
    else {
      sVar6 = strlen(pcVar13);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar13,sVar6);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout," --help\' to see all supported options",0x25);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
    std::ostream::put('8');
    std::ostream::flush();
    return 0;
  }
  atomicNonce.super___atomic_base<unsigned_int>._M_i = (__atomic_base<unsigned_int>)0;
  lVar17 = 0;
  do {
    LOCK();
    result.hash[lVar17].super___atomic_base<unsigned_long>._M_i = 0;
    UNLOCK();
    lVar17 = lVar17 + 1;
  } while (lVar17 != 4);
  vms.super__Vector_base<randomx_vm_*,_std::allocator<randomx_vm_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  vms.super__Vector_base<randomx_vm_*,_std::allocator<randomx_vm_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  vms.super__Vector_base<randomx_vm_*,_std::allocator<randomx_vm_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (bVar1) {
    local_114 = std::thread::hardware_concurrency();
    rVar4 = randomx_get_flags();
  }
  else {
    rVar4 = local_78 + RANDOMX_FLAG_ARGON2_AVX2;
    if (!bVar27) {
      rVar4 = local_78;
    }
    rVar5 = rVar4 | RANDOMX_FLAG_HARD_AES;
    if ((char)local_84 != '\0') {
      rVar5 = rVar4;
    }
    rVar4 = rVar5 | RANDOMX_FLAG_JIT;
    if (!bVar26) {
      rVar4 = rVar5;
    }
  }
  rVar4 = local_118 & 0xff | rVar4;
  rVar5 = rVar4 | RANDOMX_FLAG_FULL_MEM;
  if (cVar24 == '\0') {
    rVar5 = rVar4;
  }
  rVar4 = rVar5 | RANDOMX_FLAG_SECURE;
  if ((char)local_80 == '\0') {
    rVar4 = rVar5;
  }
  bVar28 = (rVar4 & RANDOMX_FLAG_ARGON2_SSSE3) == RANDOMX_FLAG_DEFAULT;
  pcVar13 = " - Argon2 implementation: SSSE3";
  if (bVar28) {
    pcVar13 = " - Argon2 implementation: reference";
  }
  bVar26 = (rVar4 & RANDOMX_FLAG_ARGON2_AVX2) == RANDOMX_FLAG_DEFAULT;
  pcVar20 = " - Argon2 implementation: AVX2";
  if (bVar26) {
    pcVar20 = pcVar13;
  }
  lVar17 = 0x1e;
  if (bVar26) {
    lVar17 = (ulong)bVar28 * 4 + 0x1f;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar20,lVar17);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
  std::ostream::put('8');
  std::ostream::flush();
  pcVar13 = " - full memory mode (2080 MiB)";
  if ((rVar4 & RANDOMX_FLAG_FULL_MEM) == RANDOMX_FLAG_DEFAULT) {
    pcVar13 = " - light memory mode (256 MiB)";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar13,0x1e);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
  std::ostream::put('8');
  std::ostream::flush();
  if ((rVar4 & RANDOMX_FLAG_JIT) == RANDOMX_FLAG_DEFAULT) {
    lVar17 = 0x13;
    pcVar13 = " - interpreted mode";
LAB_00108d62:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar13,lVar17);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout," - JIT compiled mode ",0x15);
    if ((rVar4 & RANDOMX_FLAG_SECURE) != RANDOMX_FLAG_DEFAULT) {
      lVar17 = 8;
      pcVar13 = "(secure)";
      goto LAB_00108d62;
    }
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
  std::ostream::put('8');
  std::ostream::flush();
  pcVar13 = " - hardware AES mode";
  if ((rVar4 & RANDOMX_FLAG_HARD_AES) == RANDOMX_FLAG_DEFAULT) {
    pcVar13 = " - software AES mode";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar13,0x14);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
  std::ostream::put('8');
  std::ostream::flush();
  pcVar13 = " - large pages mode";
  if ((rVar4 & RANDOMX_FLAG_LARGE_PAGES) == RANDOMX_FLAG_DEFAULT) {
    pcVar13 = " - small pages mode";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar13,0x13);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
  std::ostream::put('8');
  std::ostream::flush();
  if (local_b0 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout," - thread affinity (",0x14);
    mask_to_string_abi_cxx11_((string *)&func,local_b0);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)func,local_68);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,")",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    if (func != (MineFunc *)local_60) {
      operator_delete(func);
    }
  }
  if (bVar2) {
    func = mine<false>;
  }
  else {
    func = mine<true>;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," - batch mode",0xd);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
    std::ostream::put('8');
    std::ostream::flush();
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Initializing",0xc);
  if (cVar24 != '\0') {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," (",2);
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_114);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," thread",7);
    pcVar13 = ")";
    if (1 < (int)local_114) {
      pcVar13 = "s)";
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,pcVar13,(ulong)(1 < (int)local_114) + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ...",4);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
  std::ostream::put('8');
  std::ostream::flush();
  if ((rVar4 & RANDOMX_FLAG_ARGON2_AVX2) == RANDOMX_FLAG_DEFAULT) {
    if ((rVar4 & RANDOMX_FLAG_ARGON2_SSSE3) == RANDOMX_FLAG_DEFAULT) {
      pcVar8 = randomx_argon2_fill_segment_ref;
    }
    else {
      pcVar8 = randomx_argon2_impl_ssse3();
    }
  }
  else {
    pcVar8 = randomx_argon2_impl_avx2();
  }
  if (pcVar8 == (randomx_argon2_impl *)0x0) {
    prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar11,"Unsupported Argon2 implementation");
    __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((rVar4 & RANDOMX_FLAG_JIT) == RANDOMX_FLAG_DEFAULT) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "WARNING: You are using the interpreter mode. Use --jit for optimal performance.",
               0x4f);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
    std::ostream::put('8');
    std::ostream::flush();
  }
  lVar17 = std::chrono::_V2::system_clock::now();
  cache = randomx_alloc_cache(rVar4);
  if (cache == (randomx_cache *)0x0) {
    ppuVar15 = &CacheAllocException::typeinfo;
    ppuVar23 = &PTR__exception_00120ef0;
LAB_0010989f:
    puVar12 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar12 = ppuVar23;
    __cxa_throw(puVar12,ppuVar15,std::exception::~exception);
  }
  randomx_init_cache(cache,seed,4);
  if (cVar24 != '\0') {
    dataset = randomx_alloc_dataset(rVar4);
    if (dataset == (randomx_dataset *)0x0) {
      ppuVar15 = &DatasetAllocException::typeinfo;
      ppuVar23 = &PTR__exception_00120f18;
      dataset = (randomx_dataset *)0x0;
      goto LAB_0010989f;
    }
    uVar9 = randomx_dataset_item_count();
    if ((int)local_114 < 2) {
      randomx_init_dataset(dataset,cache,0,uVar9 & 0xffffffff);
    }
    else {
      uVar25 = (ulong)local_114;
      _startItem = (AtomicHash *)((ulong)_startItem & 0xffffffff00000000);
      uVar21 = local_114;
      local_11c = uVar22;
      local_98 = lVar17;
      do {
        iVar3 = 0;
        if (uVar21 == 1) {
          iVar3 = (int)((uVar9 & 0xffffffff) % uVar25);
        }
        count = iVar3 + (int)((uVar9 & 0xffffffff) / uVar25);
        local_90._M_data = (atomic<unsigned_int> *)randomx_init_dataset;
        std::thread::
        thread<void(*)(randomx_dataset*,randomx_cache*,unsigned_long,unsigned_long),randomx_dataset*&,randomx_cache*&,unsigned_int&,unsigned_int&,void>
                  ((thread *)&vm,
                   (_func_void_randomx_dataset_ptr_randomx_cache_ptr_unsigned_long_unsigned_long **)
                   &local_90,&dataset,&cache,&startItem,&count);
        std::vector<std::thread,_std::allocator<std::thread>_>::emplace_back<std::thread>
                  (&threads,(thread *)&vm);
        iVar3 = local_108;
        uVar22 = local_11c;
        if (vm != (randomx_vm *)0x0) {
          std::terminate();
        }
        startItem = startItem + count;
        uVar21 = uVar21 - 1;
      } while (uVar21 != 0);
      lVar17 = local_98;
      if (threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
          super__Vector_impl_data._M_start) {
        uVar25 = 1;
        do {
          std::thread::join();
          bVar28 = uVar25 < (ulong)((long)threads.
                                          super__Vector_base<std::thread,_std::allocator<std::thread>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)threads.
                                          super__Vector_base<std::thread,_std::allocator<std::thread>_>
                                          ._M_impl.super__Vector_impl_data._M_start >> 3);
          uVar25 = (ulong)((int)uVar25 + 1);
          lVar17 = local_98;
        } while (bVar28);
      }
    }
    randomx_release_cache(cache);
    cache = (randomx_cache *)0x0;
    ptVar14 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_start) {
      do {
        if ((ptVar14->_M_id)._M_thread != 0) {
          std::terminate();
        }
        ptVar14 = ptVar14 + 1;
      } while (ptVar14 !=
               threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
               super__Vector_impl_data._M_finish);
      threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_finish =
           threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
           super__Vector_impl_data._M_start;
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Memory initialized in ",0x16);
  lVar10 = std::chrono::_V2::system_clock::now();
  lVar10 = lVar10 - lVar17;
  auVar31._8_4_ = (int)((ulong)lVar10 >> 0x20);
  auVar31._0_8_ = lVar10;
  auVar31._12_4_ = 0x45300000;
  poVar7 = std::ostream::_M_insert<double>
                     (((auVar31._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)lVar10) - 4503599627370496.0)) /
                      1000000000.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," s",2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Initializing ",0xd);
  poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," virtual machine(s) ...",0x17);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  iVar16 = iVar3;
  do {
    vm = randomx_create_vm(rVar4,cache,dataset);
    if (vm == (randomx_vm *)0x0) {
      prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
      if ((rVar4 & RANDOMX_FLAG_HARD_AES) == RANDOMX_FLAG_DEFAULT) {
        if ((undefined1)local_118 == '\0') {
          std::runtime_error::runtime_error(prVar11,"Cannot create VM");
        }
        else {
          std::runtime_error::runtime_error
                    (prVar11,"Cannot create VM with the selected options. Try without --largePages")
          ;
        }
      }
      else {
        std::runtime_error::runtime_error
                  (prVar11,"Cannot create VM with the selected options. Try using --softAes");
      }
      __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if (vms.super__Vector_base<randomx_vm_*,_std::allocator<randomx_vm_*>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        vms.super__Vector_base<randomx_vm_*,_std::allocator<randomx_vm_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<randomx_vm*,std::allocator<randomx_vm*>>::_M_realloc_insert<randomx_vm*const&>
                ((vector<randomx_vm*,std::allocator<randomx_vm*>> *)&vms,
                 (iterator)
                 vms.super__Vector_base<randomx_vm_*,_std::allocator<randomx_vm_*>_>._M_impl.
                 super__Vector_impl_data._M_finish,&vm);
    }
    else {
      *vms.super__Vector_base<randomx_vm_*,_std::allocator<randomx_vm_*>_>._M_impl.
       super__Vector_impl_data._M_finish = vm;
      vms.super__Vector_base<randomx_vm_*,_std::allocator<randomx_vm_*>_>._M_impl.
      super__Vector_impl_data._M_finish =
           vms.super__Vector_base<randomx_vm_*,_std::allocator<randomx_vm_*>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
    iVar16 = iVar16 + -1;
  } while (iVar16 != 0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Running benchmark (",0x13);
  poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,noncesCount);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," nonces) ...",0xc);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  lVar17 = std::chrono::_V2::system_clock::now();
  if (iVar3 < 2) {
    (*func)(*vms.super__Vector_base<randomx_vm_*,_std::allocator<randomx_vm_*>_>._M_impl.
             super__Vector_impl_data._M_start,&atomicNonce,&result,noncesCount,0,-1);
  }
  else {
    count = 0;
    if (vms.super__Vector_base<randomx_vm_*,_std::allocator<randomx_vm_*>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        vms.super__Vector_base<randomx_vm_*,_std::allocator<randomx_vm_*>_>._M_impl.
        super__Vector_impl_data._M_start) {
      do {
        cpuid = -1;
        if (local_b0 != 0) {
          cpuid = cpuid_from_mask(local_b0,&count);
        }
        local_90._M_data = &atomicNonce;
        _startItem = &result;
        std::thread::
        thread<void(*&)(randomx_vm*,std::atomic<unsigned_int>&,AtomicHash&,unsigned_int,int,int),randomx_vm*&,std::reference_wrapper<std::atomic<unsigned_int>>,std::reference_wrapper<AtomicHash>,int&,unsigned_int&,int&,void>
                  ((thread *)&vm,
                   (_func_void_randomx_vm_ptr_atomic<unsigned_int>_ptr_AtomicHash_ptr_uint_int_int
                    **)&func,
                   vms.super__Vector_base<randomx_vm_*,_std::allocator<randomx_vm_*>_>._M_impl.
                   super__Vector_impl_data._M_start + count,&local_90,
                   (reference_wrapper<AtomicHash> *)&startItem,&noncesCount,&count,&cpuid);
        std::vector<std::thread,_std::allocator<std::thread>_>::emplace_back<std::thread>
                  (&threads,(thread *)&vm);
        if (vm != (randomx_vm *)0x0) {
          std::terminate();
        }
        count = count + 1;
      } while ((ulong)count <
               (ulong)((long)vms.super__Vector_base<randomx_vm_*,_std::allocator<randomx_vm_*>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)vms.super__Vector_base<randomx_vm_*,_std::allocator<randomx_vm_*>_>.
                             _M_impl.super__Vector_impl_data._M_start >> 3));
    }
    uVar22 = local_11c;
    if (threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_start) {
      uVar25 = 1;
      do {
        std::thread::join();
        bVar28 = uVar25 < (ulong)((long)threads.
                                        super__Vector_base<std::thread,_std::allocator<std::thread>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)threads.
                                        super__Vector_base<std::thread,_std::allocator<std::thread>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 3);
        uVar25 = (ulong)((int)uVar25 + 1);
      } while (bVar28);
    }
  }
  lVar10 = std::chrono::_V2::system_clock::now();
  if (vms.super__Vector_base<randomx_vm_*,_std::allocator<randomx_vm_*>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      vms.super__Vector_base<randomx_vm_*,_std::allocator<randomx_vm_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar25 = 0;
    uVar19 = 1;
    do {
      randomx_destroy_vm(vms.super__Vector_base<randomx_vm_*,_std::allocator<randomx_vm_*>_>._M_impl
                         .super__Vector_impl_data._M_start[uVar25]);
      bVar28 = uVar19 < (ulong)((long)vms.
                                      super__Vector_base<randomx_vm_*,_std::allocator<randomx_vm_*>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)vms.
                                      super__Vector_base<randomx_vm_*,_std::allocator<randomx_vm_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 3);
      uVar25 = uVar19;
      uVar19 = (ulong)((int)uVar19 + 1);
    } while (bVar28);
  }
  if ((char)uVar22 == '\0') {
    randomx_release_cache(cache);
  }
  else {
    randomx_release_dataset(dataset);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Calculated result: ",0x13);
  AtomicHash::print(&result,(ostream *)&std::cout);
  if ((local_104 == (char  [4])0x0) && (noncesCount == 1000)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "Reference result:  10b649a3f15c7c7f88277812f2e74b337a0f20ce909af09199cccb960771cfa1"
               ,0x53);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
    std::ostream::put('8');
    std::ostream::flush();
  }
  lVar10 = lVar10 - lVar17;
  auVar29._8_4_ = (int)((ulong)lVar10 >> 0x20);
  auVar29._0_8_ = lVar10;
  auVar29._12_4_ = 0x45300000;
  dVar30 = ((auVar29._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)lVar10) - 4503599627370496.0)) / 1000000000.0;
  if ((char)uVar22 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Performance: ",0xd);
    poVar7 = std::ostream::_M_insert<double>((dVar30 * 1000.0) / (double)noncesCount);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," ms per hash",0xc);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Performance: ",0xd);
    poVar7 = std::ostream::_M_insert<double>((double)noncesCount / dVar30);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," hashes per second",0x12);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  }
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&threads);
  if (vms.super__Vector_base<randomx_vm_*,_std::allocator<randomx_vm_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(vms.super__Vector_base<randomx_vm_*,_std::allocator<randomx_vm_*>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return 0;
}

Assistant:

int main(int argc, char** argv) {
	bool softAes, miningMode, verificationMode, help, largePages, jit, secure;
	bool ssse3, avx2, autoFlags, noBatch;
	int noncesCount, threadCount, initThreadCount;
	uint64_t threadAffinity;
	int32_t seedValue;
	char seed[4];

	readOption("--softAes", argc, argv, softAes);
	readOption("--mine", argc, argv, miningMode);
	readOption("--verify", argc, argv, verificationMode);
	readIntOption("--threads", argc, argv, threadCount, 1);
	readUInt64Option("--affinity", argc, argv, threadAffinity, 0);
	readIntOption("--nonces", argc, argv, noncesCount, 1000);
	readIntOption("--init", argc, argv, initThreadCount, 1);
	readIntOption("--seed", argc, argv, seedValue, 0);
	readOption("--largePages", argc, argv, largePages);
	if (!largePages) {
		readOption("--largepages", argc, argv, largePages);
	}
	readOption("--jit", argc, argv, jit);
	readOption("--help", argc, argv, help);
	readOption("--secure", argc, argv, secure);
	readOption("--ssse3", argc, argv, ssse3);
	readOption("--avx2", argc, argv, avx2);
	readOption("--auto", argc, argv, autoFlags);
	readOption("--noBatch", argc, argv, noBatch);

	store32(&seed, seedValue);

	std::cout << "RandomX benchmark v1.1.11" << std::endl;

	if (help) {
		printUsage(argv[0]);
		return 0;
	}

	if (!miningMode && !verificationMode) {
		std::cout << "Please select either the fast mode (--mine) or the slow mode (--verify)" << std::endl;
		std::cout << "Run '" << argv[0] << " --help' to see all supported options" << std::endl;
		return 0;
	}

	std::atomic<uint32_t> atomicNonce(0);
	AtomicHash result;
	std::vector<randomx_vm*> vms;
	std::vector<std::thread> threads;
	randomx_dataset* dataset;
	randomx_cache* cache;
	randomx_flags flags;

	if (autoFlags) {
		initThreadCount = std::thread::hardware_concurrency();
		flags = randomx_get_flags();
	}
	else {
		flags = RANDOMX_FLAG_DEFAULT;
		if (ssse3) {
			flags |= RANDOMX_FLAG_ARGON2_SSSE3;
		}
		if (avx2) {
			flags |= RANDOMX_FLAG_ARGON2_AVX2;
		}
		if (!softAes) {
			flags |= RANDOMX_FLAG_HARD_AES;
		}
		if (jit) {
			flags |= RANDOMX_FLAG_JIT;
#ifdef RANDOMX_FORCE_SECURE
			flags |= RANDOMX_FLAG_SECURE;
#endif
		}
	}

	if (largePages) {
		flags |= RANDOMX_FLAG_LARGE_PAGES;
	}
	if (miningMode) {
		flags |= RANDOMX_FLAG_FULL_MEM;
	}
#ifndef RANDOMX_FORCE_SECURE
	if (secure) {
		flags |= RANDOMX_FLAG_SECURE;
	}
#endif

	if (flags & RANDOMX_FLAG_ARGON2_AVX2) {
		std::cout << " - Argon2 implementation: AVX2" << std::endl;
	}
	else if (flags & RANDOMX_FLAG_ARGON2_SSSE3) {
		std::cout << " - Argon2 implementation: SSSE3" << std::endl;
	}
	else {
		std::cout << " - Argon2 implementation: reference" << std::endl;
	}

	if (flags & RANDOMX_FLAG_FULL_MEM) {
		std::cout << " - full memory mode (2080 MiB)" << std::endl;
	}
	else {
		std::cout << " - light memory mode (256 MiB)" << std::endl;
	}

	if (flags & RANDOMX_FLAG_JIT) {
		std::cout << " - JIT compiled mode ";
		if (flags & RANDOMX_FLAG_SECURE) {
			std::cout << "(secure)";
		}
		std::cout << std::endl;
	}
	else {
		std::cout << " - interpreted mode" << std::endl;
	}

	if (flags & RANDOMX_FLAG_HARD_AES) {
		std::cout << " - hardware AES mode" << std::endl;
	}
	else {
		std::cout << " - software AES mode" << std::endl;
	}

	if (flags & RANDOMX_FLAG_LARGE_PAGES) {
		std::cout << " - large pages mode" << std::endl;
	}
	else {
		std::cout << " - small pages mode" << std::endl;
	}

	if (threadAffinity) {
		std::cout << " - thread affinity (" << mask_to_string(threadAffinity) << ")" << std::endl;
	}

	MineFunc* func;

	if (noBatch) {
		func = &mine<false>;
	}
	else {
		func = &mine<true>;
		std::cout << " - batch mode" << std::endl;
	}

	std::cout << "Initializing";
	if (miningMode)
		std::cout << " (" << initThreadCount << " thread" << (initThreadCount > 1 ? "s)" : ")");
	std::cout << " ..." << std::endl;

	try {
		if (nullptr == randomx::selectArgonImpl(flags)) {
			throw std::runtime_error("Unsupported Argon2 implementation");
		}
		if ((flags & RANDOMX_FLAG_JIT) && !RANDOMX_HAVE_COMPILER) {
			throw std::runtime_error("JIT compilation is not supported on this platform. Try without --jit");
		}
		if (!(flags & RANDOMX_FLAG_JIT) && RANDOMX_HAVE_COMPILER) {
			std::cout << "WARNING: You are using the interpreter mode. Use --jit for optimal performance." << std::endl;
		}

		Stopwatch sw(true);
		cache = randomx_alloc_cache(flags);
		if (cache == nullptr) {
			throw CacheAllocException();
		}
		randomx_init_cache(cache, &seed, sizeof(seed));
		if (miningMode) {
			dataset = randomx_alloc_dataset(flags);
			if (dataset == nullptr) {
				throw DatasetAllocException();
			}
			uint32_t datasetItemCount = randomx_dataset_item_count();
			if (initThreadCount > 1) {
				auto perThread = datasetItemCount / initThreadCount;
				auto remainder = datasetItemCount % initThreadCount;
				uint32_t startItem = 0;
				for (int i = 0; i < initThreadCount; ++i) {
					auto count = perThread + (i == initThreadCount - 1 ? remainder : 0);
					threads.push_back(std::thread(&randomx_init_dataset, dataset, cache, startItem, count));
					startItem += count;
				}
				for (unsigned i = 0; i < threads.size(); ++i) {
					threads[i].join();
				}
			}
			else {
				randomx_init_dataset(dataset, cache, 0, datasetItemCount);
			}
			randomx_release_cache(cache);
			cache = nullptr;
			threads.clear();
		}
		std::cout << "Memory initialized in " << sw.getElapsed() << " s" << std::endl;
		std::cout << "Initializing " << threadCount << " virtual machine(s) ..." << std::endl;
		for (int i = 0; i < threadCount; ++i) {
			randomx_vm *vm = randomx_create_vm(flags, cache, dataset);
			if (vm == nullptr) {
				if ((flags & RANDOMX_FLAG_HARD_AES)) {
					throw std::runtime_error("Cannot create VM with the selected options. Try using --softAes");
				}
				if (largePages) {
					throw std::runtime_error("Cannot create VM with the selected options. Try without --largePages");
				}
				throw std::runtime_error("Cannot create VM");
			}
			vms.push_back(vm);
		}
		std::cout << "Running benchmark (" << noncesCount << " nonces) ..." << std::endl;
		sw.restart();
		if (threadCount > 1) {
			for (unsigned i = 0; i < vms.size(); ++i) {
				int cpuid = -1;
				if (threadAffinity)
					cpuid = cpuid_from_mask(threadAffinity, i);
				threads.push_back(std::thread(func, vms[i], std::ref(atomicNonce), std::ref(result), noncesCount, i, cpuid));
			}
			for (unsigned i = 0; i < threads.size(); ++i) {
				threads[i].join();
			}
		}
		else {
			func(vms[0], std::ref(atomicNonce), std::ref(result), noncesCount, 0, -1);
		}

		double elapsed = sw.getElapsed();
		for (unsigned i = 0; i < vms.size(); ++i)
			randomx_destroy_vm(vms[i]);
		if (miningMode)
			randomx_release_dataset(dataset);
		else
			randomx_release_cache(cache);
		std::cout << "Calculated result: ";
		result.print(std::cout);
		if (noncesCount == 1000 && seedValue == 0)
			std::cout << "Reference result:  10b649a3f15c7c7f88277812f2e74b337a0f20ce909af09199cccb960771cfa1" << std::endl;
		if (!miningMode) {
			std::cout << "Performance: " << 1000 * elapsed / noncesCount << " ms per hash" << std::endl;
		}
		else {
			std::cout << "Performance: " << noncesCount / elapsed << " hashes per second" << std::endl;
		}
	}
	catch (MemoryException& e) {
		std::cout << "ERROR: " << e.what() << std::endl;
		if (largePages) {
#ifdef _WIN32
			std::cout << "To use large pages, please enable the \"Lock Pages in Memory\" policy and reboot." << std::endl;
			if (!IsWindows8OrGreater()) {
				std::cout << "Additionally, you have to run the benchmark from elevated command prompt." << std::endl;
			}
#else
			std::cout << "To use large pages, please run: sudo sysctl -w vm.nr_hugepages=1250" << std::endl;
#endif
		}
		return 1;
	}
	catch (std::exception& e) {
		std::cout << "ERROR: " << e.what() << std::endl;
		return 1;
	}
	return 0;
}